

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acecMult.c
# Opt level: O2

Vec_Bit_t * Acec_BoothFindPPG(Gia_Man_t *p)

{
  int i;
  Vec_Bit_t *p_00;
  Vec_Int_t *p_01;
  int Entry;
  int i_00;
  
  p_00 = Vec_BitStart(p->nObjs);
  p_01 = Acec_MultFindPPs(p);
  for (i_00 = 0; i_00 < p_01->nSize; i_00 = i_00 + 1) {
    i = Vec_IntEntry(p_01,i_00);
    Vec_BitWriteEntry(p_00,i,Entry);
  }
  Vec_IntFree(p_01);
  return p_00;
}

Assistant:

Vec_Bit_t * Acec_BoothFindPPG( Gia_Man_t * p )
{
    Vec_Bit_t * vIgnore = Vec_BitStart( Gia_ManObjNum(p) );
    Vec_Int_t * vMap = Acec_MultFindPPs( p );
    int i, Entry;
    Vec_IntForEachEntry( vMap, Entry, i )
        Vec_BitWriteEntry( vIgnore, Entry, 1 );
    Vec_IntFree( vMap );
    return vIgnore;
}